

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottiemodel.h
# Opt level: O2

void rlottie::internal::model::PathData::lerp(PathData *start,PathData *end,float t,VPath *result)

{
  VPointF VVar1;
  VPointF VVar2;
  pointer pVVar3;
  pointer pVVar4;
  pointer pVVar5;
  pointer pVVar6;
  ulong uVar7;
  size_t i;
  VPointF *p;
  ulong uVar8;
  float fVar9;
  float fVar10;
  VPointF local_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  VPointF local_40;
  VPointF local_38;
  
  local_58 = t;
  VPath::reset(result);
  pVVar3 = (start->mPoints).super__Vector_base<VPointF,_std::allocator<VPointF>_>._M_impl.
           super__Vector_impl_data._M_start;
  pVVar4 = (start->mPoints).super__Vector_base<VPointF,_std::allocator<VPointF>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pVVar3 != pVVar4) {
    pVVar5 = (end->mPoints).super__Vector_base<VPointF,_std::allocator<VPointF>_>._M_impl.
             super__Vector_impl_data._M_start;
    pVVar6 = (end->mPoints).super__Vector_base<VPointF,_std::allocator<VPointF>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pVVar5 != pVVar6) {
      uVar7 = (long)pVVar4 - (long)pVVar3 >> 3;
      uVar8 = (long)pVVar6 - (long)pVVar5 >> 3;
      if (uVar7 <= uVar8) {
        uVar8 = uVar7;
      }
      VPath::reserve(result,uVar8 + 1,uVar8 / 3 + 2);
      VVar1 = *(end->mPoints).super__Vector_base<VPointF,_std::allocator<VPointF>_>._M_impl.
               super__Vector_impl_data._M_start;
      VVar2 = *(start->mPoints).super__Vector_base<VPointF,_std::allocator<VPointF>_>._M_impl.
               super__Vector_impl_data._M_start;
      fVar9 = VVar2.mx;
      fVar10 = VVar2.my;
      fStack_54 = local_58;
      fStack_50 = local_58;
      fStack_4c = local_58;
      p = &local_60;
      local_60.my = (VVar1.my - fVar10) * local_58 + fVar10;
      local_60.mx = (VVar1.mx - fVar9) * local_58 + fVar9;
      VPath::moveTo(result,p);
      for (uVar7 = 1; uVar7 < uVar8; uVar7 = uVar7 + 3) {
        pVVar3 = (start->mPoints).super__Vector_base<VPointF,_std::allocator<VPointF>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pVVar4 = (end->mPoints).super__Vector_base<VPointF,_std::allocator<VPointF>_>._M_impl.
                 super__Vector_impl_data._M_start;
        fVar9 = pVVar3[uVar7].mx;
        fVar10 = pVVar3[uVar7].my;
        local_60.my = (pVVar4[uVar7].my - fVar10) * fStack_54 + fVar10;
        local_60.mx = (pVVar4[uVar7].mx - fVar9) * local_58 + fVar9;
        fVar9 = pVVar3[uVar7 + 1].mx;
        fVar10 = pVVar3[uVar7 + 1].my;
        local_38.my = (pVVar4[uVar7 + 1].my - fVar10) * fStack_54 + fVar10;
        local_38.mx = (pVVar4[uVar7 + 1].mx - fVar9) * local_58 + fVar9;
        fVar9 = pVVar3[uVar7 + 2].mx;
        fVar10 = pVVar3[uVar7 + 2].my;
        local_40.my = (pVVar4[uVar7 + 2].my - fVar10) * fStack_54 + fVar10;
        local_40.mx = (pVVar4[uVar7 + 2].mx - fVar9) * local_58 + fVar9;
        p = &local_60;
        VPath::cubicTo(result,p,&local_38,&local_40);
      }
      if (start->mClosed != false) {
        VPath::close(result,(int)p);
      }
    }
  }
  return;
}

Assistant:

static void lerp(const PathData &start, const PathData &end, float t,
                     VPath &result)
    {
        result.reset();
        // test for empty animation data.
        if (start.mPoints.empty() || end.mPoints.empty())
        {
            return;
        }
        auto size = std::min(start.mPoints.size(), end.mPoints.size());
        /* reserve exact memory requirement at once
         * ptSize = size + 1(size + close)
         * elmSize = size/3 cubic + 1 move + 1 close
         */
        result.reserve(size + 1, size / 3 + 2);
        result.moveTo(start.mPoints[0] +
                      t * (end.mPoints[0] - start.mPoints[0]));
        for (size_t i = 1; i < size; i += 3) {
            result.cubicTo(
                start.mPoints[i] + t * (end.mPoints[i] - start.mPoints[i]),
                start.mPoints[i + 1] +
                    t * (end.mPoints[i + 1] - start.mPoints[i + 1]),
                start.mPoints[i + 2] +
                    t * (end.mPoints[i + 2] - start.mPoints[i + 2]));
        }
        if (start.mClosed) result.close();
    }